

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform_scalar_fe_space.h
# Opt level: O0

shared_ptr<const_lf::mesh::Mesh> __thiscall
lf::uscalfe::UniformScalarFESpace<double>::Mesh(UniformScalarFESpace<double> *this)

{
  shared_ptr<const_lf::mesh::Mesh> sVar1;
  UniformScalarFESpace<double> *this_local;
  
  sVar1 = assemble::UniformFEDofHandler::Mesh((UniformFEDofHandler *)this);
  sVar1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_lf::mesh::Mesh>)
         sVar1.super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

[[nodiscard]] std::shared_ptr<const lf::mesh::Mesh> Mesh() const override {
    return dofh_.Mesh();
  }